

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_dex_decrements_Test::~CpuTest_dex_decrements_Test
          (CpuTest_dex_decrements_Test *this)

{
  CpuTest_dex_decrements_Test *this_local;
  
  ~CpuTest_dex_decrements_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, dex_decrements) {
    stage_instruction(DEX);
    registers.x = 3;
    expected.x = 2;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}